

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

WriteDescriptorResult __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::writeDescriptor
          (DeferredThirdPartyClient *this,Builder descriptor,Vector<int> *fds)

{
  Builder descriptor_00;
  Tag TVar1;
  RpcClient *pRVar2;
  RpcConnectionState *cap_00;
  RefOrVoid<capnp::ClientHook> fds_00;
  OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
  *in_RDX;
  ClientHook *extraout_RDX;
  WriteDescriptorResult WVar4;
  undefined8 local_98 [4];
  undefined8 local_78;
  Own<capnp::ClientHook,_std::nullptr_t> *local_70;
  Own<capnp::ClientHook,_std::nullptr_t> *_kj_switch_done_1;
  Own<capnp::ClientHook,_std::nullptr_t> *cap;
  Deferred *local_38;
  Deferred *_kj_switch_done;
  Deferred *deferred;
  OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
  *_kj_switch_subject;
  Vector<int> *fds_local;
  DeferredThirdPartyClient *this_local;
  ClientHook *pCVar3;
  
  _kj_switch_subject = in_RDX;
  fds_local = fds;
  this_local = this;
  deferred = (Deferred *)
             kj::
             OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
             ::_switchSubject((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
                               *)(fds + 2));
  TVar1 = kj::
          OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
          ::which((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
                   *)deferred);
  if (TVar1 == _variant0) {
    local_38 = kj::
               OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
               ::
               get<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred>
                         ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
                           *)deferred);
    if (local_38 != (Deferred *)0x0) {
      _kj_switch_done = local_38;
      pRVar2 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::
               operator->(&local_38->vine);
      memcpy(&cap,&descriptor,0x28);
      (*(pRVar2->super_ClientHook)._vptr_ClientHook[9])(this,pRVar2,_kj_switch_subject);
      pCVar3 = extraout_RDX;
LAB_0053d5a9:
      WVar4.described = pCVar3;
      WVar4.exportId.ptr = (NullableValue<unsigned_int>)this;
      return WVar4;
    }
    local_38 = (Deferred *)0x0;
    _kj_switch_done = (Deferred *)0x0;
  }
  else if (TVar1 == _variant1) {
    local_70 = kj::
               OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,kj::Own<capnp::ClientHook,decltype(nullptr)>>
               ::get<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                         ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                           *)deferred);
    if (local_70 != (Own<capnp::ClientHook,_std::nullptr_t> *)0x0) {
      _kj_switch_done_1 = local_70;
      cap_00 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                         ((Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *)
                          (fds + 1));
      fds_00 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator*(_kj_switch_done_1);
      memcpy(local_98,&descriptor,0x28);
      descriptor_00._builder.capTable._0_4_ = (int)local_98[1];
      descriptor_00._builder.segment = (SegmentBuilder *)local_98[0];
      descriptor_00._builder.capTable._4_4_ = (int)((ulong)local_98[1] >> 0x20);
      descriptor_00._builder.data._0_4_ = (int)local_98[2];
      descriptor_00._builder.data._4_4_ = (int)((ulong)local_98[2] >> 0x20);
      descriptor_00._builder.pointers._0_4_ = (int)local_98[3];
      descriptor_00._builder.pointers._4_4_ = (int)((ulong)local_98[3] >> 0x20);
      descriptor_00._builder.dataSize = (undefined4)local_78;
      descriptor_00._builder.pointerCount = local_78._4_2_;
      descriptor_00._builder._38_2_ = local_78._6_2_;
      WVar4 = RpcConnectionState::writeDescriptor
                        ((RpcConnectionState *)this,(ClientHook *)cap_00,descriptor_00,
                         (Vector<int> *)fds_00);
      pCVar3 = WVar4.described;
      goto LAB_0053d5a9;
    }
    local_70 = (Own<capnp::ClientHook,_std::nullptr_t> *)0x0;
    _kj_switch_done_1 = (Own<capnp::ClientHook,_std::nullptr_t> *)0x0;
  }
  kj::_::unreachable();
}

Assistant:

WriteDescriptorResult writeDescriptor(rpc::CapDescriptor::Builder descriptor,
                                          kj::Vector<int>& fds) override {
      KJ_SWITCH_ONEOF(state) {
        KJ_CASE_ONEOF(deferred, Deferred) {
          // A ThirdPartyCapDescriptor was sent to us, and we are sending it *back* over the same
          // connection we received it from.
          //
          // The easiest way to handle this is to send back the vine, which after all points to
          // the capability that the other side originally sent us.
          return deferred.vine->writeDescriptor(descriptor, fds);
        }
        KJ_CASE_ONEOF(cap, kj::Own<ClientHook>) {
          return connectionState->writeDescriptor(*cap, descriptor, fds);
        }
      }
      KJ_UNREACHABLE;
    }